

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

TestNode * __thiscall xe::ConstTestNodeIterator::operator*(ConstTestNodeIterator *this)

{
  TestGroup *this_00;
  size_type sVar1;
  const_reference pvVar2;
  ConstTestNodeIterator *this_local;
  
  sVar1 = std::
          vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
          ::size(&this->m_iterStack);
  if (sVar1 == 1) {
    this_local = (ConstTestNodeIterator *)this->m_root;
  }
  else {
    pvVar2 = std::
             vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ::back(&this->m_iterStack);
    this_00 = pvVar2->group;
    pvVar2 = std::
             vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ::back(&this->m_iterStack);
    this_local = (ConstTestNodeIterator *)TestGroup::getChild(this_00,pvVar2->childNdx);
  }
  return (TestNode *)this_local;
}

Assistant:

const TestNode* ConstTestNodeIterator::operator* (void) const
{
	DE_ASSERT(!m_iterStack.empty());
	if (m_iterStack.size() == 1)
	{
		DE_ASSERT(m_iterStack[0].group == DE_NULL && m_iterStack[0].childNdx == 0);
		return m_root;
	}
	else
		return m_iterStack.back().group->getChild(m_iterStack.back().childNdx);
}